

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::TrimLeftRightHelper<true,false>
              (JavascriptString *arg,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  char16 *pcVar4;
  JavascriptLibrary *this;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  int idxEnd;
  char16 ch;
  int idxStart;
  char16 *string;
  int len;
  ScriptContext *scriptContext_local;
  JavascriptString *arg_local;
  
  cVar3 = GetLength(arg);
  pcVar4 = GetString(arg);
  idxEnd = 0;
  while ((idxEnd < (int)cVar3 && (bVar2 = IsWhiteSpaceCharacter(pcVar4[idxEnd]), bVar2))) {
    idxEnd = idxEnd + 1;
  }
  if (cVar3 == idxEnd) {
    this = ScriptContext::GetLibrary(scriptContext);
    arg_local = JavascriptLibrary::GetEmptyString(this);
  }
  else if (idxEnd == 0) {
    pSVar5 = RecyclableObject::GetScriptContext(&arg->super_RecyclableObject);
    arg_local = arg;
    if (scriptContext != pSVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0x9f4,"(scriptContext == arg->GetScriptContext())",
                                  "Should have already marshaled the string in cross site thunk");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  else {
    arg_local = (JavascriptString *)SubstringCore(arg,idxEnd,cVar3 - idxEnd,scriptContext);
  }
  return arg_local;
}

Assistant:

Var JavascriptString::TrimLeftRightHelper(JavascriptString* arg, ScriptContext* scriptContext)
    {
        static_assert(trimLeft || trimRight, "bad template instance of TrimLeftRightHelper()");

        int len = arg->GetLength();
        const char16 *string = arg->GetString();

        int idxStart = 0;
        if (trimLeft)
        {
            for (; idxStart < len; idxStart++)
            {
                char16 ch = string[idxStart];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (len == idxStart)
            {
                return (scriptContext->GetLibrary()->GetEmptyString());
            }
        }

        int idxEnd = len - 1;
        if (trimRight)
        {
            for (; idxEnd >= 0; idxEnd--)
            {
                char16 ch = string[idxEnd];
                if (IsWhiteSpaceCharacter(ch))
                {
                    continue;
                }
                break;
            }

            if (!trimLeft)
            {
                if (idxEnd < 0)
                {
                    Assert(idxEnd == -1);
                    return (scriptContext->GetLibrary()->GetEmptyString());
                }
            }
            else
            {
                Assert(idxEnd >= 0);
            }
        }

        if (idxStart == 0 && idxEnd == len - 1)
        {
            AssertMsg(scriptContext == arg->GetScriptContext(), "Should have already marshaled the string in cross site thunk");
            return arg;
        }

        return SubstringCore(arg, idxStart, idxEnd - idxStart + 1, scriptContext);
    }